

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O3

VFSNode __thiscall VFS::CVFS::CVFSDir::Copy(CVFSDir *this)

{
  CVFSDir *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CVFSDir *in_RSI;
  VFSNode VVar1;
  _Alloc_hider _Stack_20;
  
  this_00 = (CVFSDir *)operator_new(0x80);
  CVFSDir(this_00,in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VFS::CVFS::CVFSDir*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_20,this_00);
  (this->super_CVFSNode)._vptr_CVFSNode = (_func_int **)this_00;
  (this->super_CVFSNode).m_Name._M_dataplus._M_p = _Stack_20._M_p;
  VVar1.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar1.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_CVFSNode
  ;
  return (VFSNode)VVar1.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VFSNode Copy() override
                    {
                        return VFSDir(new CVFSDir(*this));
                    }